

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O2

void __thiscall ExpandTabs_TwoTabs_Test::~ExpandTabs_TwoTabs_Test(ExpandTabs_TwoTabs_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ExpandTabs, TwoTabs) {
    {
        auto const in1 = "a\tb\tc"s;
        std::string out1;
        pstore::dump::expand_tabs (std::begin (in1), std::end (in1), std::back_inserter (out1), 8U);
        EXPECT_EQ (out1, "a       b       c");
    }
    {
        auto const in2 = "\t1234567\t12345678"s;
        std::string out2;
        pstore::dump::expand_tabs (std::begin (in2), std::end (in2), std::back_inserter (out2), 8U);
        EXPECT_EQ (out2, "        1234567 12345678");
    }
}